

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::ImageSizeMachine::Equal(ImageSizeMachine *this,ivec4 *result,ivec4 *expected)

{
  int iVar1;
  int *piVar2;
  ivec4 *expected_local;
  ivec4 *result_local;
  ImageSizeMachine *this_local;
  
  piVar2 = tcu::Vector<int,_4>::operator[](expected,0);
  iVar1 = *piVar2;
  piVar2 = tcu::Vector<int,_4>::operator[](result,0);
  if (iVar1 == *piVar2) {
    piVar2 = tcu::Vector<int,_4>::operator[](expected,1);
    iVar1 = *piVar2;
    piVar2 = tcu::Vector<int,_4>::operator[](result,1);
    if (iVar1 == *piVar2) {
      piVar2 = tcu::Vector<int,_4>::operator[](expected,2);
      iVar1 = *piVar2;
      piVar2 = tcu::Vector<int,_4>::operator[](result,2);
      if (iVar1 == *piVar2) {
        piVar2 = tcu::Vector<int,_4>::operator[](expected,3);
        iVar1 = *piVar2;
        piVar2 = tcu::Vector<int,_4>::operator[](result,3);
        if (iVar1 == *piVar2) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Equal(const ivec4& result, const ivec4& expected)
	{
		if (expected[0] != result[0])
			return false;
		if (expected[1] != result[1])
			return false;
		if (expected[2] != result[2])
			return false;
		if (expected[3] != result[3])
			return false;
		return true;
	}